

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<float,(unsigned_char)4>,float>(Thread *this)

{
  Simd<float,_(unsigned_char)__x04_> value;
  float *__first;
  float *__last;
  float afStack_24 [2];
  Simd<float,_(unsigned_char)__x04_> result;
  float val;
  Thread *this_local;
  
  unique0x10000121 = this;
  result.v[2] = Pop<float>(this);
  __first = std::begin<float,4ul>((float (*) [4])afStack_24);
  __last = std::end<float,4ul>((float (*) [4])afStack_24);
  std::fill<float*,float>(__first,__last,result.v + 2);
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = afStack_24[0];
  value.v[1] = afStack_24[1];
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}